

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug_Utilities.cpp
# Opt level: O2

void Nova::Function_Is_Not_Defined(char *function,char *file,uint line,type_info *type)

{
  ostream *poVar1;
  runtime_error *this;
  allocator local_31;
  string error;
  
  sprintf(Function_Is_Not_Defined::buffer,"%s:%s:%d: Function not defined by %s",file,function,
          (ulong)line,*(char **)(type + 8) + (**(char **)(type + 8) == '*'));
  std::__cxx11::string::string((string *)&error,Function_Is_Not_Defined::buffer,&local_31);
  std::ostream::flush();
  std::operator<<(Log::(anonymous_namespace)::cerr,"\n");
  poVar1 = std::operator<<(Log::(anonymous_namespace)::cerr,"\n*** ERROR: ");
  poVar1 = std::operator<<(poVar1,(string *)&error);
  poVar1 = std::operator<<(poVar1,'\n');
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)&error);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Nova::Function_Is_Not_Defined(const char* function,const char* file,unsigned int line,const std::type_info& type)
{
    static char buffer[2048];
    sprintf(buffer,"%s:%s:%d: Function not defined by %s",file,function,line,type.name());
    std::string error(buffer);
    Log::cout<<std::flush;Log::cerr<<"\n";
    Log::cerr<<"\n*** ERROR: "<<error<<'\n'<<std::endl;
    throw std::runtime_error(error);
}